

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O1

MidiEvent * __thiscall
smf::MidiEvent::operator=
          (MidiEvent *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  pointer puVar1;
  long lVar2;
  
  this->m_eventlink = (MidiEvent *)0x0;
  this->tick = 0;
  this->track = 0;
  this->seconds = 0.0;
  this->seq = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             (long)(bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start);
  puVar1 = (this->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < *(int *)&(this->super_MidiMessage).
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (int)puVar1) {
    lVar2 = 0;
    do {
      puVar1[lVar2] =
           (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar2];
      lVar2 = lVar2 + 1;
      puVar1 = (this->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
               .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar2 < *(int *)&(this->super_MidiMessage).
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (int)puVar1);
  }
  return this;
}

Assistant:

MidiEvent& MidiEvent::operator=(const vector<uchar>& bytes) {
	clearVariables();
	this->resize(bytes.size());
	for (int i=0; i<(int)this->size(); i++) {
		(*this)[i] = bytes[i];
	}
	return *this;
}